

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jerror.c
# Opt level: O0

void emit_message(j_common_ptr cinfo,int msg_level)

{
  long lVar1;
  int in_ESI;
  long *in_RDI;
  jpeg_error_mgr *err;
  
  lVar1 = *in_RDI;
  if (in_ESI < 0) {
    if ((*(long *)(lVar1 + 0x80) == 0) || (2 < *(int *)(lVar1 + 0x7c))) {
      (**(code **)(lVar1 + 0x10))(in_RDI);
    }
    *(long *)(lVar1 + 0x80) = *(long *)(lVar1 + 0x80) + 1;
  }
  else if (in_ESI <= *(int *)(lVar1 + 0x7c)) {
    (**(code **)(lVar1 + 0x10))(in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
emit_message(j_common_ptr cinfo, int msg_level)
{
  struct jpeg_error_mgr *err = cinfo->err;

  if (msg_level < 0) {
    /* It's a warning message.  Since corrupt files may generate many warnings,
     * the policy implemented here is to show only the first warning,
     * unless trace_level >= 3.
     */
    if (err->num_warnings == 0 || err->trace_level >= 3)
      (*err->output_message) (cinfo);
    /* Always count warnings in num_warnings. */
    err->num_warnings++;
  } else {
    /* It's a trace message.  Show it if trace_level >= msg_level. */
    if (err->trace_level >= msg_level)
      (*err->output_message) (cinfo);
  }
}